

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawfunc.cpp
# Opt level: O0

int main(void)

{
  squirrel_error *e;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  undefined1 local_68 [8];
  VMStd vm;
  
  vm.super_VM.root_table_._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl._4_4_ = 0;
  squall::VMStd::VMStd((VMStd *)local_68,0x400);
  squall::VMStd::dofile((VMStd *)local_68,"rawfunc.nut");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"foo",&local_99);
  squall::VM::defraw((VM *)local_68,(string *)local_98,foo);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"bar",(allocator *)((long)&e + 7));
  squall::VM::call<void>((VM *)local_68,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  squall::VMStd::~VMStd((VMStd *)local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("rawfunc.nut");

        vm.defraw("foo", foo);
        vm.call<void>("bar");
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}